

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledRgbaInputFile::FromYa::readTile(FromYa *this,int dx,int dy,int lx,int ly)

{
  Rgba *pRVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  ArgExc *this_00;
  long lVar6;
  ulong uVar7;
  Rgba *pRVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint n;
  Box2i dw;
  undefined1 local_1b8 [392];
  
  if (this->_fbBase != (Rgba *)0x0) {
    TiledInputFile::readTile(this->_inputFile,dx,dy,lx,ly);
    TiledInputFile::dataWindowForTile((TiledInputFile *)local_1b8,(int)this->_inputFile,dx,dy,lx);
    if ((int)local_1b8._4_4_ <= (int)local_1b8._12_4_) {
      iVar3 = local_1b8._8_4_ - local_1b8._0_4_;
      n = iVar3 + 1;
      pRVar1 = this->_fbBase;
      lVar12 = 0;
      lVar10 = 0;
      lVar11 = (long)(int)local_1b8._4_4_;
      do {
        if (-1 < iVar3) {
          pRVar8 = (this->_buf)._data;
          lVar6 = (this->_buf)._sizeY * lVar12;
          uVar7 = 0;
          do {
            *(uint16_t *)((long)&pRVar8[uVar7].r._h + lVar6) = 0;
            *(uint16_t *)((long)&pRVar8[uVar7].b._h + lVar6) = 0;
            uVar7 = uVar7 + 1;
          } while (n != uVar7);
        }
        pRVar8 = (this->_buf)._data + (this->_buf)._sizeY * lVar10;
        RgbaYca::YCAtoRGBA(&this->_yw,n,pRVar8,pRVar8);
        if ((int)local_1b8._0_4_ <= (int)local_1b8._8_4_) {
          lVar9 = 0;
          lVar6 = (long)(int)local_1b8._0_4_;
          do {
            pRVar1[this->_fbYStride * lVar11 + this->_fbXStride * lVar6] =
                 *(Rgba *)((long)&(((this->_buf)._data)->r)._h +
                          lVar9 + (this->_buf)._sizeY * lVar12);
            lVar9 = lVar9 + 8;
            bVar2 = lVar6 < (int)local_1b8._8_4_;
            lVar6 = lVar6 + 1;
          } while (bVar2);
        }
        lVar10 = lVar10 + 1;
        lVar12 = lVar12 + 8;
        bVar2 = lVar11 < (int)local_1b8._12_4_;
        lVar11 = lVar11 + 1;
      } while (bVar2);
    }
    return;
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1b8 + 0x10),
             "No frame buffer was specified as the pixel data destination for image file \"",0x4c);
  pcVar4 = TiledInputFile::fileName(this->_inputFile);
  poVar5 = std::operator<<((ostream *)(local_1b8 + 0x10),pcVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)local_1b8);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

void
TiledRgbaInputFile::FromYa::readTile (int dx, int dy, int lx, int ly)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputFile.fileName ()
                 << "\".");
    }

    //
    // Read the tile requested by the caller into _buf.
    //

    _inputFile.readTile (dx, dy, lx, ly);

    //
    // Convert the luminance/alpha pixels to RGBA
    // and copy them into the caller's frame buffer.
    //

    Box2i    dw    = _inputFile.dataWindowForTile (dx, dy, lx, ly);
    int      width = dw.max.x - dw.min.x + 1;
    intptr_t base  = reinterpret_cast<intptr_t> (_fbBase);

    for (int y = dw.min.y, y1 = 0; y <= dw.max.y; ++y, ++y1)
    {
        for (int x1 = 0; x1 < width; ++x1)
        {
            _buf[y1][x1].r = 0;
            _buf[y1][x1].b = 0;
        }

        YCAtoRGBA (_yw, width, _buf[y1], _buf[y1]);

        for (int x = dw.min.x, x1 = 0; x <= dw.max.x; ++x, ++x1)
        {
            Rgba* ptr = reinterpret_cast<Rgba*> (
                base + sizeof (Rgba) * (x * _fbXStride + y * _fbYStride));
            *ptr = _buf[y1][x1];
        }
    }
}